

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O2

void * __thiscall rlist::listSearchKey(rlist *this,void *value)

{
  int iVar1;
  listNode *ptr;
  rlist *this_00;
  
  ptr = this->rl->head;
  this_00 = this;
  if (ptr != (listNode *)0x0) {
    while (this->view = ptr, ptr != (listNode *)0x0) {
      iVar1 = match(this_00,ptr,value);
      if (iVar1 != 0) {
        return this->view;
      }
      ptr = this->view->next;
    }
  }
  return (void *)0x0;
}

Assistant:

void * rlist::listSearchKey(void *value){
    if(rl->head!=NULL){
        view=rl->head;
        while(view!=NULL){
            if(rlist::match(view,value))
                return view;
            view=view->next;
        }
    }
    return NULL;
}